

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O0

void Saig_ManDupCones_rec
               (Aig_Man_t *p,Aig_Obj_t *pObj,Vec_Ptr_t *vLeaves,Vec_Ptr_t *vNodes,Vec_Ptr_t *vRoots)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Vec_Ptr_t *vRoots_local;
  Vec_Ptr_t *vNodes_local;
  Vec_Ptr_t *vLeaves_local;
  Aig_Obj_t *pObj_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Aig_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Aig_ObjIsNode(pObj);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsCo(pObj);
      if (iVar1 == 0) {
        iVar1 = Saig_ObjIsLo(p,pObj);
        if (iVar1 == 0) {
          iVar1 = Saig_ObjIsPi(p,pObj);
          if (iVar1 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/saig/saigDup.c"
                          ,0x21f,
                          "void Saig_ManDupCones_rec(Aig_Man_t *, Aig_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
                         );
          }
          Vec_PtrPush(vLeaves,pObj);
        }
        else {
          pAVar2 = Saig_ObjLoToLi(p,pObj);
          Vec_PtrPush(vRoots,pAVar2);
        }
      }
      else {
        pAVar2 = Aig_ObjFanin0(pObj);
        Saig_ManDupCones_rec(p,pAVar2,vLeaves,vNodes,vRoots);
      }
    }
    else {
      pAVar2 = Aig_ObjFanin0(pObj);
      Saig_ManDupCones_rec(p,pAVar2,vLeaves,vNodes,vRoots);
      pAVar2 = Aig_ObjFanin1(pObj);
      Saig_ManDupCones_rec(p,pAVar2,vLeaves,vNodes,vRoots);
      Vec_PtrPush(vNodes,pObj);
    }
  }
  return;
}

Assistant:

void Saig_ManDupCones_rec( Aig_Man_t * p, Aig_Obj_t * pObj, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vNodes, Vec_Ptr_t * vRoots )
{
    if ( Aig_ObjIsTravIdCurrent(p, pObj) )
        return;
    Aig_ObjSetTravIdCurrent(p, pObj);
    if ( Aig_ObjIsNode(pObj) )
    {
        Saig_ManDupCones_rec( p, Aig_ObjFanin0(pObj), vLeaves, vNodes, vRoots );
        Saig_ManDupCones_rec( p, Aig_ObjFanin1(pObj), vLeaves, vNodes, vRoots );
        Vec_PtrPush( vNodes, pObj );
    }
    else if ( Aig_ObjIsCo(pObj) )
        Saig_ManDupCones_rec( p, Aig_ObjFanin0(pObj), vLeaves, vNodes, vRoots );
    else if ( Saig_ObjIsLo(p, pObj) )
        Vec_PtrPush( vRoots, Saig_ObjLoToLi(p, pObj) );
    else if ( Saig_ObjIsPi(p, pObj) )
        Vec_PtrPush( vLeaves, pObj );
    else assert( 0 );
}